

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall brown::Tile::drawcirc(Tile *this,int xc,int yc,int r,uint32_t col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  
  local_68 = 1 - r;
  iVar3 = 0;
  local_70 = 3;
  local_6c = yc;
  local_64 = xc;
  while( true ) {
    drawpix(this,xc + iVar3,r + yc,col);
    drawpix(this,r + xc,iVar3 + yc,col);
    drawpix(this,r + xc,local_6c,col);
    drawpix(this,xc + iVar3,yc - r,col);
    drawpix(this,local_64,r + yc,col);
    drawpix(this,xc - r,iVar3 + yc,col);
    drawpix(this,xc - r,local_6c,col);
    drawpix(this,local_64,yc - r,col);
    iVar1 = iVar3 - r;
    if (r <= iVar3) break;
    iVar2 = local_70;
    if (-1 < local_68) {
      r = r + -1;
      iVar2 = iVar1 * 2 + 5;
    }
    local_68 = local_68 + iVar2;
    iVar3 = iVar3 + 1;
    local_70 = local_70 + 2;
    local_64 = local_64 + -1;
    local_6c = local_6c + -1;
  }
  return;
}

Assistant:

void Tile::drawcirc (int xc, int yc, int r, std::uint32_t col)
{
    int x, y, d;
    for(x=0,y=r,d=1-r;1;x++)
    {
        this->drawpix(xc+x,yc+y,col); this->drawpix(xc+y,yc+x,col);
        this->drawpix(xc+y,yc-x,col); this->drawpix(xc+x,yc-y,col);
        this->drawpix(xc-x,yc+y,col); this->drawpix(xc-y,yc+x,col);
        this->drawpix(xc-y,yc-x,col); this->drawpix(xc-x,yc-y,col);
        if (x >= y) break;
        if (d < 0) { d += ( x   <<1)+3; } else
                      { d += ((x-y)<<1)+5; y--; }
    }
}